

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall matchit::impl::Id<int>::reset(Id<int> *this,int32_t depth)

{
  IdBlockBase<int> *this_00;
  int32_t depth_local;
  Id<int> *this_local;
  
  this_00 = &block(this)->super_IdBlockBase<int>;
  IdBlockBase<int>::reset(this_00,depth);
  return;
}

Assistant:

constexpr void reset(int32_t depth) const { return block().reset(depth); }